

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

IssuanceParameter * __thiscall
cfd::core::ConfidentialTransaction::SetAssetReissuance
          (IssuanceParameter *__return_storage_ptr__,ConfidentialTransaction *this,
          uint32_t tx_in_index,Amount *asset_amount,
          vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *asset_output_amount_list,
          vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *asset_locking_script_list,
          vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
          *asset_blind_nonce_list,BlindFactor *asset_blind_factor,BlindFactor *entropy)

{
  ByteData256 *__x;
  pointer pAVar1;
  Script *pSVar2;
  pointer pCVar3;
  ByteData issuance_amount_rangeproof;
  ByteData inflation_keys_rangeproof;
  _func_int **pp_Var4;
  IssuanceParameter *this_00;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  int64_t iVar8;
  CfdException *pCVar9;
  Script *this_01;
  long lVar10;
  long lVar11;
  Amount *amount;
  pointer pAVar12;
  long lVar13;
  ulong uVar14;
  ConfidentialNonce nonce;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *__range3;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_178;
  IssuanceParameter *local_160;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *local_158;
  ConfidentialTransaction *local_150;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> asset;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_118;
  ConfidentialAssetId *local_100;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_f8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_e0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_b0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  ConfidentialValue local_80;
  ConfidentialValue local_58;
  
  local_160 = __return_storage_ptr__;
  local_158 = asset_locking_script_list;
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xb])
            (this,(ulong)tx_in_index,0x7c8,"SetAssetReissuance");
  local_150 = this;
  ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&nonce,
             &(this->vin_).
              super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
              ._M_impl.super__Vector_impl_data._M_start[tx_in_index].inflation_keys_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_178,&nonce.data_.data_)
  ;
  sVar7 = ByteData::GetDataSize((ByteData *)&local_178);
  if (sVar7 == 0) {
    ConfidentialValue::ConfidentialValue
              ((ConfidentialValue *)&asset,
               &(local_150->vin_).
                super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
                ._M_impl.super__Vector_impl_data._M_start[tx_in_index].issuance_amount_);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_118,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish);
    sVar7 = ByteData::GetDataSize((ByteData *)&local_118);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_118);
    ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&asset);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_178);
    ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&nonce);
    if (sVar7 == 0) {
      iVar8 = Amount::GetSatoshiValue(asset_amount);
      if (iVar8 < 1) {
        nonce._vptr_ConfidentialNonce = (_func_int **)0x231217;
        nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = 0x7d2;
        nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = "SetAssetReissuance";
        logger::warn<>((CfdSourceLocation *)&nonce,"ReIssuance must have one non-zero amount.");
        pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&nonce,"ReIssuance must have one non-zero amount.",(allocator *)&asset)
        ;
        CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)&nonce);
        __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
      }
      pAVar12 = (asset_output_amount_list->
                super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pAVar1 = (asset_output_amount_list->
               super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if ((pAVar12 == pAVar1) ==
          ((local_158->super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>).
           _M_impl.super__Vector_impl_data._M_start ==
          (local_158->super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>).
          _M_impl.super__Vector_impl_data._M_finish)) {
        if (pAVar12 != pAVar1) {
          Amount::Amount((Amount *)&asset);
          pAVar1 = (asset_output_amount_list->
                   super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          for (pAVar12 = (asset_output_amount_list->
                         super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>).
                         _M_impl.super__Vector_impl_data._M_start; pAVar12 != pAVar1;
              pAVar12 = pAVar12 + 1) {
            Amount::operator+=((Amount *)&asset,pAVar12);
          }
          bVar5 = Amount::operator!=((Amount *)&asset,asset_amount);
          if (bVar5) {
            nonce._vptr_ConfidentialNonce = (_func_int **)0x231217;
            nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x7e4;
            nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = "SetAssetReissuance";
            logger::warn<>((CfdSourceLocation *)&nonce,"Unmatch asset amount.");
            pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
            ::std::__cxx11::string::string
                      ((string *)&nonce,"Unmatch asset amount.",(allocator *)&local_178);
            CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)&nonce);
            __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
          }
          this_01 = (local_158->
                    super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          pSVar2 = (local_158->
                   super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          while (this_01 != pSVar2) {
            bVar5 = Script::IsEmpty(this_01);
            this_01 = this_01 + 1;
            if (bVar5) {
              nonce._vptr_ConfidentialNonce = (_func_int **)0x231217;
              nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x7e9;
              nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish = "SetAssetReissuance";
              logger::warn<>((CfdSourceLocation *)&nonce,"Empty locking script from asset.");
              pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
              ::std::__cxx11::string::string
                        ((string *)&nonce,"Empty locking script from asset.",(allocator *)&local_178
                        );
              CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)&nonce);
              __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
            }
          }
        }
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&asset,0x20,
                   (allocator_type *)&nonce);
        __x = &entropy->data_;
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_178,&__x->data_);
        ByteData256::GetBytes
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&nonce,
                   (ByteData256 *)&local_178);
        pp_Var4 = nonce._vptr_ConfidentialNonce;
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c8,&__x->data_);
        ByteData256::GetBytes
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_118,
                   (ByteData256 *)&local_c8);
        iVar6 = wally_tx_elements_issuance_calculate_asset
                          (pp_Var4,(long)local_118._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_118._M_impl.super__Vector_impl_data._M_start,
                           asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start,
                           (long)asset.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)asset.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&local_118);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_c8)
        ;
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&nonce);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&local_178);
        this_00 = local_160;
        ret = iVar6;
        if (iVar6 == 0) {
          IssuanceParameter::IssuanceParameter(local_160);
          BlindFactor::operator=(&this_00->entropy,entropy);
          ByteData::ByteData((ByteData *)&local_178,&asset);
          ConfidentialAssetId::ConfidentialAssetId
                    ((ConfidentialAssetId *)&nonce,(ByteData *)&local_178);
          local_100 = &local_160->asset;
          ConfidentialAssetId::operator=(local_100,(ConfidentialAssetId *)&nonce);
          ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&nonce);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&local_178);
          ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e0,
                     &(asset_blind_factor->data_).data_);
          ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f8,&__x->data_)
          ;
          ConfidentialValue::ConfidentialValue(&local_58,asset_amount);
          ConfidentialValue::ConfidentialValue(&local_80);
          ByteData::ByteData((ByteData *)&local_98);
          ByteData::ByteData((ByteData *)&local_b0);
          issuance_amount_rangeproof.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)&local_b0;
          issuance_amount_rangeproof.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)&local_98;
          issuance_amount_rangeproof.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)nonce._vptr_ConfidentialNonce;
          inflation_keys_rangeproof.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_ =
               nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start._4_4_;
          inflation_keys_rangeproof.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ =
               nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start._0_4_;
          inflation_keys_rangeproof.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish =
               nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          inflation_keys_rangeproof.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
          SetIssuance(local_150,tx_in_index,(ByteData256 *)&local_e0,(ByteData256 *)&local_f8,
                      &local_58,&local_80,issuance_amount_rangeproof,inflation_keys_rangeproof);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&local_b0);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&local_98);
          ConfidentialValue::~ConfidentialValue(&local_80);
          ConfidentialValue::~ConfidentialValue(&local_58);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&local_f8);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&local_e0);
          if ((asset_output_amount_list->
              super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
              super__Vector_impl_data._M_start !=
              (asset_output_amount_list->
              super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
              super__Vector_impl_data._M_finish) {
            iVar8 = Amount::GetSatoshiValue(asset_amount);
            if (0 < iVar8) {
              lVar13 = 0;
              lVar10 = 0;
              lVar11 = 0;
              for (uVar14 = 0;
                  uVar14 < (ulong)((long)(asset_output_amount_list->
                                         super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
                                         )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(asset_output_amount_list->
                                         super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
                                         )._M_impl.super__Vector_impl_data._M_start >> 4);
                  uVar14 = uVar14 + 1) {
                ConfidentialNonce::ConfidentialNonce(&nonce);
                pCVar3 = (asset_blind_nonce_list->
                         super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                if (uVar14 < (ulong)(((long)(asset_blind_nonce_list->
                                            super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pCVar3) / 0x28)) {
                  ConfidentialNonce::operator=
                            (&nonce,(ConfidentialNonce *)
                                    ((long)&pCVar3->_vptr_ConfidentialNonce + lVar13));
                }
                AddTxOut(local_150,
                         (Amount *)
                         ((long)&((asset_output_amount_list->
                                  super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->amount_ + lVar10),
                         local_100,
                         (Script *)
                         ((long)&((local_158->
                                  super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->_vptr_Script + lVar11
                         ),&nonce);
                ConfidentialNonce::~ConfidentialNonce(&nonce);
                lVar11 = lVar11 + 0x38;
                lVar10 = lVar10 + 0x10;
                lVar13 = lVar13 + 0x28;
              }
            }
          }
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
          return local_160;
        }
        nonce._vptr_ConfidentialNonce = (_func_int **)0x231217;
        nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = 0x7f6;
        nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = "SetAssetReissuance";
        logger::warn<int&>((CfdSourceLocation *)&nonce,
                           "wally_tx_elements_issuance_calculate_asset NG[{}].",&ret);
        pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&nonce,"asset calculate error.",(allocator *)&local_178);
        CfdException::CfdException(pCVar9,kCfdIllegalStateError,(string *)&nonce);
        __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
      }
      nonce._vptr_ConfidentialNonce = (_func_int **)0x231217;
      nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0x7d8;
      nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = "SetAssetReissuance";
      logger::warn<>((CfdSourceLocation *)&nonce,
                     "Unmatch count. asset amount list and locking script list.");
      pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&nonce,"Unmatch count. asset amount list and locking script list.",
                 (allocator *)&asset);
      CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)&nonce);
      __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  else {
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_178);
    ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&nonce);
  }
  nonce._vptr_ConfidentialNonce = (_func_int **)0x231217;
  nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x7cc;
  nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "SetAssetReissuance";
  logger::warn<>((CfdSourceLocation *)&nonce,"already set to reissue parameter");
  pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&nonce,"already set to reissue parameter",(allocator *)&asset);
  CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)&nonce);
  __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

IssuanceParameter ConfidentialTransaction::SetAssetReissuance(
    uint32_t tx_in_index, const Amount &asset_amount,
    const std::vector<Amount> &asset_output_amount_list,
    const std::vector<Script> &asset_locking_script_list,
    const std::vector<ConfidentialNonce> &asset_blind_nonce_list,
    const BlindFactor &asset_blind_factor, const BlindFactor &entropy) {
  CheckTxInIndex(tx_in_index, __LINE__, __FUNCTION__);

  if ((vin_[tx_in_index].GetInflationKeys().GetData().GetDataSize() > 0) ||
      (vin_[tx_in_index].GetIssuanceAmount().GetData().GetDataSize() > 0)) {
    warn(CFD_LOG_SOURCE, "already set to reissue parameter");
    throw CfdException(
        kCfdIllegalArgumentError, "already set to reissue parameter");
  }

  if (asset_amount.GetSatoshiValue() <= 0) {
    warn(CFD_LOG_SOURCE, "ReIssuance must have one non-zero amount.");
    throw CfdException(
        kCfdIllegalArgumentError, "ReIssuance must have one non-zero amount.");
  }
  if (asset_output_amount_list.empty() != asset_locking_script_list.empty()) {
    warn(
        CFD_LOG_SOURCE,
        "Unmatch count. asset amount list and locking script list.");
    throw CfdException(
        kCfdIllegalArgumentError,
        "Unmatch count. asset amount list and locking script list.");
  }
  if (!asset_output_amount_list.empty()) {
    Amount total;
    for (const auto &amount : asset_output_amount_list) {
      total += amount;
    }
    if (total != asset_amount) {
      warn(CFD_LOG_SOURCE, "Unmatch asset amount.");
      throw CfdException(kCfdIllegalArgumentError, "Unmatch asset amount.");
    }
    for (const auto &script : asset_locking_script_list) {
      if (script.IsEmpty()) {
        warn(CFD_LOG_SOURCE, "Empty locking script from asset.");
        throw CfdException(
            kCfdIllegalArgumentError, "Empty locking script from asset.");
      }
    }
  }

  std::vector<uint8_t> asset(kAssetSize);
  int ret = wally_tx_elements_issuance_calculate_asset(
      entropy.GetData().GetBytes().data(), entropy.GetData().GetBytes().size(),
      asset.data(), asset.size());
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE, "wally_tx_elements_issuance_calculate_asset NG[{}].",
        ret);
    throw CfdException(kCfdIllegalStateError, "asset calculate error.");
  }

  IssuanceParameter param;
  param.entropy = entropy;
  param.asset = ConfidentialAssetId(ByteData(asset));
  SetIssuance(
      tx_in_index, asset_blind_factor.GetData(), entropy.GetData(),
      ConfidentialValue(asset_amount), ConfidentialValue(), ByteData(),
      ByteData());

  if ((!asset_output_amount_list.empty()) &&
      (asset_amount.GetSatoshiValue() > 0)) {
    for (size_t index = 0; index < asset_output_amount_list.size(); ++index) {
      ConfidentialNonce nonce;
      if (index < asset_blind_nonce_list.size()) {
        nonce = asset_blind_nonce_list[index];
      }
      AddTxOut(
          asset_output_amount_list[index], param.asset,
          asset_locking_script_list[index], nonce);
    }
  }
  return param;
}